

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receiver.c
# Opt level: O1

void receiver_run(receiver *rx,short *buf,int len)

{
  short sVar1;
  int iVar2;
  time_t tVar3;
  uint uVar4;
  uchar uVar5;
  ulong uVar6;
  uint uVar7;
  char b;
  float filtered [8192];
  char local_803d;
  float local_803c;
  float local_8038 [8194];
  
  if (0x2000 < len) {
    abort();
  }
  sVar1 = filter_run_buf(rx->filter,buf + rx->ch_ofs,local_8038,rx->num_ch,len);
  if (0 < len) {
    uVar6 = 0;
    do {
      uVar7 = (uint)(0.0 < local_8038[uVar6]);
      if ((rx->prev ^ uVar7) == 1) {
        if (rx->pll < 0x8000) {
          uVar4 = rx->pllinc >> 4;
        }
        else {
          uVar4 = -(rx->pllinc >> 4);
        }
        rx->pll = uVar4 + rx->pll;
      }
      rx->prev = uVar7;
      uVar4 = rx->pll + rx->pllinc;
      rx->pll = uVar4;
      if (0xffff < uVar4) {
        local_803d = rx->lastbit == uVar7;
        protodec_decode(&local_803d,1,rx->decoder);
        rx->lastbit = uVar7;
        rx->pll = (uint)(ushort)rx->pll;
      }
      uVar6 = uVar6 + 1;
    } while ((uint)len != uVar6);
  }
  local_803c = (float)(int)sVar1 * 3.0517578e-05 * 100.0;
  tVar3 = time((time_t *)0x0);
  iVar2 = (int)tVar3 - (int)rx->last_levellog;
  if (iVar2 < 1 || local_803c <= 95.0) {
    if (iVar2 < 1) {
      return;
    }
    if (on_sound_level_changed == (receiver_on_level_changed)0x0) goto LAB_0010390b;
    iVar2 = rx->ch_ofs;
    uVar5 = '\0';
  }
  else {
    if (on_sound_level_changed == (receiver_on_level_changed)0x0) goto LAB_0010390b;
    iVar2 = rx->ch_ofs;
    uVar5 = '\x01';
  }
  (*on_sound_level_changed)(local_803c,iVar2,uVar5);
LAB_0010390b:
  time(&rx->last_levellog);
  return;
}

Assistant:

void receiver_run(struct receiver *rx, short *buf, int len)
{
	float out;
	int curr, bit;
	char b;
	short maxval = 0;
	int level_distance;
	float level;
	int rx_num_ch = rx->num_ch;
    float filtered[FILTERED_LEN];
	int i;
	
	/* len is number of samples available in buffer for each
	 * channels - something like 1024, regardless of number of channels */
	
	buf += rx->ch_ofs;
	
	if (len > FILTERED_LEN)
		abort();

	maxval = filter_run_buf(rx->filter, buf, filtered, rx_num_ch, len);
	
	for (i = 0; i < len; i++) {
		out = filtered[i];
		curr = (out > 0);
		
		if ((curr ^ rx->prev) == 1) {
			if (rx->pll < (0x10000 / 2)) {
				rx->pll += rx->pllinc / INC;
			} else {
				rx->pll -= rx->pllinc / INC;
			}
		}
		rx->prev = curr;

		rx->pll += rx->pllinc;

		if (rx->pll > 0xffff) {
			/* slice */
			bit = (out > 0);
			/* nrzi decode */
			b = !(bit ^ rx->lastbit);
			/* feed to the decoder */
			protodec_decode(&b, 1, rx->decoder);

			rx->lastbit = bit;
			rx->pll &= 0xffff;
		}
	}
	
	/* calculate level, and log it */
	level = (float)maxval / (float)32768 * (float)100;
	level_distance = time(NULL) - rx->last_levellog;
	
    if (level > 95.0 && (level_distance >= 30 || level_distance >= sound_levellog)) {
        if (on_sound_level_changed != NULL) on_sound_level_changed(level, rx->ch_ofs, 1);
        time(&rx->last_levellog);
    } else if (sound_levellog != 0 && level_distance >= sound_levellog) {
        if (on_sound_level_changed != NULL) on_sound_level_changed(level, rx->ch_ofs, 0);
        time(&rx->last_levellog);
    }
}